

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_8cc60b::ProcessProductRepresentation
               (IfcProduct *el,aiNode *nd,vector<aiNode_*,_std::allocator<aiNode_*>_> *subnodes,
               ConversionData *conv)

{
  IfcRepresentation *pIVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint prevMatId;
  uint64_t id;
  Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation> *this;
  IfcProductRepresentation *pIVar5;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_1UL,_0UL> *this_00;
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  iterator iVar6;
  iterator iVar7;
  reference ppIVar8;
  Lazy *this_01;
  IfcRepresentationItem *item_00;
  IfcMappedItem *mapped;
  IfcMappedItem *geo;
  IfcRepresentationItem *item;
  const_iterator __end2;
  const_iterator __begin2;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL> *__range2;
  bool res;
  IfcRepresentation *repr;
  iterator __end1;
  iterator __begin1;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  *__range1;
  allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*> local_91;
  undefined1 local_90 [8];
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_1UL,_0UL> *src;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  uint matid;
  ConversionData *conv_local;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *subnodes_local;
  aiNode *nd_local;
  IfcProduct *el_local;
  
  bVar2 = Assimp::STEP::
          Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_>::operator!
                    (&el->Representation);
  if (!bVar2) {
    id = Assimp::STEP::Object::GetID
                   ((Object *)
                    (&(el->super_IfcObject).field_0x0 +
                    *(long *)(*(long *)&el->super_IfcObject + -0x18)));
    prevMatId = std::numeric_limits<unsigned_int>::max();
    meshes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         Assimp::IFC::ProcessMaterials(id,prevMatId,conv,false);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&src);
    this = Assimp::STEP::
           Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_>::Get
                     (&el->Representation);
    pIVar5 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>::operator->(this)
    ;
    this_00 = &pIVar5->Representations;
    __n = std::
          vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
          ::size(&this_00->
                  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                );
    std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>::allocator(&local_91);
    std::
    vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
    ::vector((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
              *)local_90,__n,&local_91);
    std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>::~allocator(&local_91);
    __first = std::
              vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
              ::begin(&this_00->
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     );
    __last = std::
             vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
             ::end(&this_00->
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                  );
    iVar6 = std::
            vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ::begin((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     *)local_90);
    std::
    copy<__gnu_cxx::__normal_iterator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>>>>,__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>>
              ((__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>_>
                )__first._M_current,
               (__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>_>
                )__last._M_current,
               (__normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
                )iVar6._M_current);
    iVar6 = std::
            vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ::begin((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     *)local_90);
    iVar7 = std::
            vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ::end((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   *)local_90);
    std::
    sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,(anonymous_namespace)::RateRepresentationPredicate>
              (iVar6._M_current,iVar7._M_current);
    __end1 = std::
             vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
             ::begin((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                      *)local_90);
    repr = (IfcRepresentation *)
           std::
           vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
           ::end((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                  *)local_90);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
                                       *)&repr), bVar2) {
      ppIVar8 = __gnu_cxx::
                __normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
                ::operator*(&__end1);
      pIVar1 = *ppIVar8;
      bVar2 = false;
      __end2 = std::
               vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
               ::begin(&(pIVar1->Items).
                        super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                      );
      item = (IfcRepresentationItem *)
             std::
             vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
             ::end(&(pIVar1->Items).
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                  );
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
                                         *)&item), bVar3) {
        this_01 = (Lazy *)__gnu_cxx::
                          __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
                          ::operator*(&__end2);
        item_00 = Assimp::STEP::Lazy::operator_cast_to_IfcRepresentationItem_(this_01);
        mapped = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcMappedItem>
                           ((Object *)
                            ((long)&(item_00->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                    )._vptr_ObjectHelper +
                            (long)(item_00->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  )._vptr_ObjectHelper[-3]));
        if (mapped == (IfcMappedItem *)0x0) {
          bVar4 = Assimp::IFC::ProcessRepresentationItem
                            (item_00,meshes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&src,conv);
          bVar3 = true;
          if (!bVar4) {
            bVar3 = bVar2;
          }
        }
        else {
          bVar4 = ProcessMappedItem(mapped,nd,subnodes,
                                    meshes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                                    conv);
          bVar3 = true;
          if (!bVar4) {
            bVar3 = bVar2;
          }
        }
        bVar2 = bVar3;
        __gnu_cxx::
        __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
        ::operator++(&__end2);
      }
      if (bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
      ::operator++(&__end1);
    }
    Assimp::IFC::AssignAddedMeshes
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&src,nd,
               conv);
    std::
    vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
    ::~vector((vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
               *)local_90);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&src);
  }
  return;
}

Assistant:

void ProcessProductRepresentation(const Schema_2x3::IfcProduct& el, aiNode* nd, std::vector< aiNode* >& subnodes, ConversionData& conv)
{
    if(!el.Representation) {
        return;
    }

    // extract Color from metadata, if present
    unsigned int matid = ProcessMaterials( el.GetID(), std::numeric_limits<uint32_t>::max(), conv, false);
    std::set<unsigned int> meshes;

    // we want only one representation type, so bring them in a suitable order (i.e try those
    // that look as if we could read them quickly at first). This way of reading
    // representation is relatively generic and allows the concrete implementations
    // for the different representation types to make some sensible choices what
    // to load and what not to load.
    const STEP::ListOf< STEP::Lazy< Schema_2x3::IfcRepresentation >, 1, 0 >& src = el.Representation.Get()->Representations;
    std::vector<const Schema_2x3::IfcRepresentation*> repr_ordered(src.size());
    std::copy(src.begin(),src.end(),repr_ordered.begin());
    std::sort(repr_ordered.begin(),repr_ordered.end(),RateRepresentationPredicate());
    for(const Schema_2x3::IfcRepresentation* repr : repr_ordered) {
        bool res = false;
        for(const Schema_2x3::IfcRepresentationItem& item : repr->Items) {
            if(const Schema_2x3::IfcMappedItem* const geo = item.ToPtr<Schema_2x3::IfcMappedItem>()) {
                res = ProcessMappedItem(*geo,nd,subnodes,matid,conv) || res;
            }
            else {
                res = ProcessRepresentationItem(item,matid,meshes,conv) || res;
            }
        }
        // if we got something meaningful at this point, skip any further representations
        if(res) {
            break;
        }
    }
    AssignAddedMeshes(meshes,nd,conv);
}